

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O3

fdb_compact_decision
cb_compact(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
          uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  fdb_kvs_handle **ppfVar1;
  fdb_kvs_handle *doc_00;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  fdb_compact_decision fVar5;
  cs_off_t cVar6;
  anomalous_callbacks *paVar7;
  filemgr_ops *pfVar8;
  size_t __size;
  void *__ptr;
  int *piVar9;
  undefined4 extraout_EDX;
  uint uVar10;
  fdb_config *fconfig;
  ulong uVar11;
  char *pcVar12;
  fdb_kvs_handle *pfVar13;
  char *unaff_R12;
  char *unaff_R13;
  anomalous_callbacks *paVar14;
  char *pcVar15;
  char value [256];
  char key [256];
  fdb_kvs_handle *pfStack_958;
  fdb_kvs_handle *pfStack_950;
  fdb_kvs_handle *pfStack_948;
  filemgr_ops *pfStack_940;
  anomalous_callbacks *paStack_938;
  fdb_kvs_config fStack_930;
  timeval tStack_918;
  fdb_kvs_handle fStack_908;
  fdb_config *pfStack_600;
  char *pcStack_5f8;
  char *pcStack_5f0;
  anomalous_callbacks *paStack_5e8;
  filemgr_ops *pfStack_5e0;
  code *pcStack_5d8;
  fdb_file_handle *pfStack_5c8;
  undefined1 auStack_5c0 [72];
  timeval tStack_578;
  fdb_config fStack_568;
  char acStack_470 [256];
  char acStack_370 [264];
  fdb_doc *pfStack_268;
  char *pcStack_260;
  timeval tStack_238;
  anomalous_callbacks local_228 [2];
  fdb_doc local_128 [3];
  
  pcVar12 = (char *)(ulong)status;
  pcVar15 = (char *)0x0;
  gettimeofday(&tStack_238,(__timezone_ptr_t)0x0);
  if (status != 2) {
LAB_00108258:
    return (fdb_compact_decision)pcVar15;
  }
  if (kv_name == (char *)0x0) {
    cb_compact();
    paVar7 = (anomalous_callbacks *)0x0;
    ctx = unaff_R12;
LAB_00108271:
    cb_compact();
LAB_00108276:
    cb_compact();
  }
  else {
    iVar3 = *(int *)((long)ctx + 0xc);
    *(int *)((long)ctx + 0xc) = iVar3 + 1;
    pcVar15 = (char *)(ulong)doc->deleted;
    if (iVar3 != *(int *)((long)ctx + 8) + -2) goto LAB_00108258;
    doc = local_128;
    sprintf((char *)doc,"key%250d");
    paVar7 = local_228;
    sprintf((char *)paVar7,"body%250d",(ulong)*(uint *)((long)ctx + 8));
    fVar2 = fdb_set_kv(*ctx,doc,0xfd,paVar7,0xfe);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00108271;
    fVar2 = fdb_commit(*(fdb_file_handle **)(*ctx + 0x28),'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00108276;
    doc = local_128;
    sprintf((char *)doc,"zzz%250d",(ulong)*(uint *)((long)ctx + 8));
    fVar2 = fdb_set_kv(*ctx,doc,0xfd,local_228,0xfe);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00108258;
  }
  cb_compact();
  pcStack_5d8 = (code *)0x10829d;
  pfStack_268 = doc;
  pcStack_260 = (char *)ctx;
  gettimeofday(&tStack_578,(__timezone_ptr_t)0x0);
  pcStack_5d8 = (code *)0x1082a2;
  memleak_start();
  pcStack_5d8 = (code *)0x1082ae;
  system("rm -rf  anomaly_test* > errorlog.txt");
  fconfig = &fStack_568;
  pcStack_5d8 = (code *)0x1082bb;
  fdb_get_default_config();
  fStack_568.buffercache_size = 0;
  pcStack_5d8 = (code *)0x1082cd;
  fdb_get_default_kvs_config();
  pcStack_5d8 = (code *)0x1082d2;
  auStack_5c0._16_8_ = get_default_anon_cbs();
  pcStack_5d8 = (code *)0x1082e1;
  filemgr_ops_anomalous_init((anomalous_callbacks *)auStack_5c0._16_8_,(void *)0x0);
  pcStack_5d8 = (code *)0x1082e6;
  auStack_5c0._8_8_ = get_normal_ops_ptr();
  pcStack_5d8 = (code *)0x1082ff;
  fVar2 = fdb_open(&pfStack_5c8,"anomaly_test1",fconfig);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_5d8 = (code *)0x10831d;
    fVar2 = fdb_kvs_open(pfStack_5c8,(fdb_kvs_handle **)(auStack_5c0 + 0x18),(char *)0x0,
                         (fdb_kvs_config *)(auStack_5c0 + 0x30));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001084c4;
    pcVar15 = "k%06d";
    ctx = acStack_370;
    unaff_R13 = "v%06d";
    pcVar12 = acStack_470;
    paVar7 = (anomalous_callbacks *)auStack_5c0;
    fconfig = (fdb_config *)0x0;
    do {
      pcStack_5d8 = (code *)0x108359;
      sprintf((char *)ctx,"k%06d",fconfig);
      pcStack_5d8 = (code *)0x108368;
      sprintf(pcVar12,"v%06d",fconfig);
      pcStack_5d8 = (code *)0x108388;
      fdb_doc_create((fdb_doc **)paVar7,ctx,8,(void *)0x0,0,pcVar12,8);
      pcStack_5d8 = (code *)0x108397;
      fVar2 = fdb_set((fdb_kvs_handle *)auStack_5c0._24_8_,(fdb_doc *)auStack_5c0._0_8_);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_5d8 = (code *)0x1084bf;
        read_old_file();
        goto LAB_001084bf;
      }
      pcStack_5d8 = (code *)0x1083a9;
      fdb_doc_free((fdb_doc *)auStack_5c0._0_8_);
      uVar10 = (int)fconfig + 1;
      fconfig = (fdb_config *)(ulong)uVar10;
    } while (uVar10 != 200);
    pcStack_5d8 = (code *)0x1083c2;
    fVar2 = fdb_commit(pfStack_5c8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001084c9;
    pcStack_5d8 = (code *)0x1083d4;
    fVar2 = fdb_close(pfStack_5c8);
    paVar14 = (anomalous_callbacks *)auStack_5c0._16_8_;
    pfVar8 = (filemgr_ops *)auStack_5c0._8_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001084ce;
    fconfig = (fdb_config *)0x140215;
    pcStack_5d8 = (code *)0x108403;
    uVar10 = (*(code *)*(_func_int_void_ptr_filemgr_ops_ptr_char_ptr_int_mode_t **)
                        auStack_5c0._16_8_)(0,auStack_5c0._8_8_,"anomaly_test1",2,0x1a4);
    pcVar12 = (char *)(ulong)uVar10;
    pcStack_5d8 = (code *)0x108411;
    cVar6 = (**(_func_cs_off_t_void_ptr_filemgr_ops_ptr_char_ptr **)((long)paVar14 + 0x28))
                      ((void *)0x0,pfVar8,"anomaly_test1");
    auStack_5c0._32_8_ = (_func_cs_off_t_void_ptr_filemgr_ops_ptr_int *)0xefbeefbefecaadde;
    auStack_5c0._40_2_ = 0xee;
    pcStack_5d8 = (code *)0x10843e;
    (**(_func_ssize_t_void_ptr_filemgr_ops_ptr_int_void_ptr_size_t_cs_off_t **)((long)paVar14 + 8))
              ((void *)0x0,pfVar8,uVar10,auStack_5c0 + 0x20,9,cVar6 + -9);
    pcStack_5d8 = (code *)0x108449;
    (**(_func_int_void_ptr_filemgr_ops_ptr_int **)((long)paVar14 + 0x18))((void *)0x0,pfVar8,uVar10)
    ;
    pcStack_5d8 = (code *)0x10845b;
    fVar2 = fdb_open(&pfStack_5c8,"anomaly_test1",&fStack_568);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001084d3;
    pcStack_5d8 = (code *)0x108469;
    fVar2 = fdb_close(pfStack_5c8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_5d8 = (code *)0x108472;
      fdb_shutdown();
      pcStack_5d8 = (code *)0x108477;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (read_old_file()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pcStack_5d8 = (code *)0x1084a8;
      iVar3 = fprintf(_stderr,pcVar12,"read an old file test");
      return iVar3;
    }
  }
  else {
LAB_001084bf:
    pcStack_5d8 = (code *)0x1084c4;
    read_old_file();
LAB_001084c4:
    pcStack_5d8 = (code *)0x1084c9;
    read_old_file();
LAB_001084c9:
    pcStack_5d8 = (code *)0x1084ce;
    read_old_file();
LAB_001084ce:
    pfVar8 = (filemgr_ops *)pcVar15;
    paVar14 = paVar7;
    pcStack_5d8 = (code *)0x1084d3;
    read_old_file();
LAB_001084d3:
    pcStack_5d8 = (code *)0x1084d8;
    read_old_file();
  }
  pcStack_5d8 = corrupted_header_correct_superblock_test;
  read_old_file();
  pfStack_600 = fconfig;
  pcStack_5f8 = (char *)ctx;
  pcStack_5f0 = unaff_R13;
  paStack_5e8 = paVar14;
  pfStack_5e0 = pfVar8;
  pcStack_5d8 = (code *)pcVar12;
  gettimeofday(&tStack_918,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  anomaly_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_908.config.encryption_key.bytes[0xc] = '\0';
  fStack_908.config.encryption_key.bytes[0xd] = '\0';
  fStack_908.config.encryption_key.bytes[0xe] = '\0';
  fStack_908.config.encryption_key.bytes[0xf] = '\0';
  fStack_908.config.encryption_key.bytes[0x10] = '\0';
  fStack_908.config.encryption_key.bytes[0x11] = '\0';
  fStack_908.config.encryption_key.bytes[0x12] = '\0';
  fStack_908.config.encryption_key.bytes[0x13] = '\0';
  fdb_get_default_kvs_config();
  paVar7 = get_default_anon_cbs();
  filemgr_ops_anomalous_init(paVar7,(void *)0x0);
  pfVar8 = get_normal_ops_ptr();
  pcVar12 = "anomaly_test1";
  pfVar13 = (fdb_kvs_handle *)&pfStack_958;
  fVar2 = fdb_open((fdb_file_handle **)pfVar13,"anomaly_test1",
                   (fdb_config *)(fStack_908.config.encryption_key.bytes + 4));
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00108860;
  pcVar12 = (char *)&pfStack_948;
  pfVar13 = pfStack_958;
  pfStack_940 = pfVar8;
  paStack_938 = paVar7;
  fVar2 = fdb_kvs_open((fdb_file_handle *)pfStack_958,(fdb_kvs_handle **)pcVar12,(char *)0x0,
                       &fStack_930);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00108865;
  ppfVar1 = &fStack_908.bub_ctx.handle;
  uVar11 = 0;
  do {
    pfVar13 = (fdb_kvs_handle *)0x0;
    do {
      sprintf((char *)ppfVar1,"k%06d",pfVar13);
      sprintf((char *)&fStack_908,"v%d_%04d",uVar11);
      fdb_doc_create((fdb_doc **)&pfStack_950,ppfVar1,8,(void *)0x0,0,&fStack_908,8);
      fVar2 = fdb_set(pfStack_948,(fdb_doc *)pfStack_950);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        corrupted_header_correct_superblock_test();
        goto LAB_00108849;
      }
      fdb_doc_free((fdb_doc *)pfStack_950);
      uVar10 = (int)pfVar13 + 1;
      pfVar13 = (fdb_kvs_handle *)(ulong)uVar10;
    } while (uVar10 != 200);
    pcVar12 = (char *)0x0;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_958,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_00108849:
      corrupted_header_correct_superblock_test();
      goto LAB_0010884e;
    }
    uVar10 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar10;
  } while (uVar10 != 4);
  pfVar13 = pfStack_958;
  fVar2 = fdb_close((fdb_file_handle *)pfStack_958);
  paVar7 = paStack_938;
  pfVar8 = pfStack_940;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010886a;
  iVar3 = (*paStack_938->open_cb)((void *)0x0,pfStack_940,"anomaly_test1",2,0x1a4);
  iVar4 = (*paVar7->open_cb)((void *)0x0,pfVar8,"anomaly_test2",0x42,0x1a4);
  __size = (*paVar7->file_size_cb)((void *)0x0,pfVar8,"anomaly_test1");
  __ptr = malloc(__size);
  (*paVar7->pread_cb)((void *)0x0,pfVar8,iVar3,__ptr,__size,0);
  (*paVar7->pwrite_cb)((void *)0x0,pfVar8,iVar4,__ptr,__size - 0x1000,0);
  (*paVar7->close_cb)((void *)0x0,pfVar8,iVar3);
  (*paVar7->close_cb)((void *)0x0,pfVar8,iVar4);
  free(__ptr);
  pfVar13 = (fdb_kvs_handle *)&pfStack_958;
  pcVar12 = "anomaly_test2";
  fVar2 = fdb_open((fdb_file_handle **)pfVar13,"anomaly_test2",
                   (fdb_config *)(fStack_908.config.encryption_key.bytes + 4));
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010886f;
  pcVar12 = (char *)&pfStack_948;
  pfVar13 = pfStack_958;
  fVar2 = fdb_kvs_open((fdb_file_handle *)pfStack_958,(fdb_kvs_handle **)pcVar12,(char *)0x0,
                       &fStack_930);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    ppfVar1 = &fStack_908.bub_ctx.handle;
    uVar10 = 0;
    do {
      sprintf((char *)ppfVar1,"k%06d",(ulong)uVar10);
      sprintf((char *)&fStack_908,"v%d_%04d",2);
      fdb_doc_create((fdb_doc **)&pfStack_950,ppfVar1,8,(void *)0x0,0,(void *)0x0,0);
      pcVar12 = (char *)pfStack_950;
      pfVar13 = pfStack_948;
      fVar2 = fdb_get(pfStack_948,(fdb_doc *)pfStack_950);
      doc_00 = pfStack_950;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010885b;
      pfVar13 = (fdb_kvs_handle *)(pfStack_950->field_6).seqtree;
      pcVar12 = (char *)&fStack_908;
      iVar3 = bcmp(pfVar13,&fStack_908,(size_t)(pfStack_950->kvs_config).custom_cmp_param);
      if (iVar3 != 0) goto LAB_0010884e;
      fdb_doc_free((fdb_doc *)doc_00);
      uVar10 = uVar10 + 1;
    } while (uVar10 != 200);
    fVar2 = fdb_close((fdb_file_handle *)pfStack_958);
    pfVar13 = pfStack_958;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (corrupted_header_correct_superblock_test()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      iVar3 = fprintf(_stderr,pcVar12,"corrupted DB header from correct superblock test");
      return iVar3;
    }
    goto LAB_00108879;
  }
  goto LAB_00108874;
LAB_0010884e:
  pcVar12 = (char *)pfVar13;
  pfVar13 = &fStack_908;
  corrupted_header_correct_superblock_test();
LAB_0010885b:
  corrupted_header_correct_superblock_test();
LAB_00108860:
  corrupted_header_correct_superblock_test();
LAB_00108865:
  corrupted_header_correct_superblock_test();
LAB_0010886a:
  corrupted_header_correct_superblock_test();
LAB_0010886f:
  corrupted_header_correct_superblock_test();
LAB_00108874:
  corrupted_header_correct_superblock_test();
LAB_00108879:
  corrupted_header_correct_superblock_test();
  iVar3 = *(int *)&(pfVar13->kvs_config).field_0x4;
  *(int *)&(pfVar13->kvs_config).field_0x4 = iVar3 + 1;
  if (iVar3 < *(int *)&(pfVar13->kvs_config).custom_cmp) {
    fVar5 = (*(code *)((fdb_kvs_handle *)pcVar12)->staletree)(extraout_EDX);
    return fVar5;
  }
  *(int *)&pfVar13->kvs_config = *(int *)&pfVar13->kvs_config + 1;
  piVar9 = __errno_location();
  *piVar9 = -2;
  return -0xe;
}

Assistant:

static fdb_compact_decision cb_compact(fdb_file_handle *fhandle,
                            fdb_compaction_status status, const char *kv_name,
                            fdb_doc *doc, uint64_t old_offset,
                            uint64_t new_offset, void *ctx)
{
    TEST_INIT();
    struct cb_cmp_args *args = (struct cb_cmp_args *)ctx;
    fdb_status fs;
    fdb_compact_decision ret = FDB_CS_KEEP_DOC;
    (void) fhandle;
    (void) doc;
    (void) old_offset;
    (void) new_offset;

    if (status == FDB_CS_MOVE_DOC) {
        TEST_CHK(kv_name);
        args->nmoves++;
        if (doc->deleted) {
            ret = FDB_CS_DROP_DOC;
        }
        if (args->nmoves == args->ndocs - 1) {
            char key[256], value[256];
            // phase 3 of compaction - uncommitted docs in old_file
            sprintf(key, "key%250d", args->ndocs);
            sprintf(value, "body%250d", args->ndocs);
            fs = fdb_set_kv(args->handle, key, 253, value, 254);
            TEST_CHK(fs == FDB_RESULT_SUCCESS);
            fs = fdb_commit(args->handle->fhandle, FDB_COMMIT_NORMAL);
            TEST_CHK(fs == FDB_RESULT_SUCCESS);

            sprintf(key, "zzz%250d", args->ndocs);
            fs = fdb_set_kv(args->handle, key, 253, value, 254);
            TEST_CHK(fs == FDB_RESULT_SUCCESS);
        }
    }

    return ret;
}